

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O3

void sptk::world::DCCorrection(double *input,double f0,int fs,int fft_size,double *output)

{
  uint uVar1;
  undefined1 auVar2 [16];
  double *yi;
  double *xi;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar12;
  
  dVar7 = (double)fft_size;
  dVar8 = (double)fs;
  iVar5 = (int)((dVar7 * f0) / dVar8);
  uVar1 = iVar5 + 2;
  uVar3 = 0xffffffffffffffff;
  if (-3 < iVar5) {
    uVar3 = (long)(int)uVar1 << 3;
  }
  dVar9 = dVar8;
  yi = (double *)operator_new__(uVar3);
  xi = (double *)operator_new__(uVar3);
  auVar2 = _DAT_00116930;
  if (-2 < iVar5) {
    uVar3 = 1;
    if (1 < (int)uVar1) {
      uVar3 = (ulong)uVar1;
    }
    lVar12 = uVar3 - 1;
    auVar6._8_4_ = (int)lVar12;
    auVar6._0_8_ = lVar12;
    auVar6._12_4_ = (int)((ulong)lVar12 >> 0x20);
    uVar4 = 0;
    auVar6 = auVar6 ^ _DAT_00116930;
    auVar11 = _DAT_00116920;
    do {
      auVar10 = auVar11 ^ auVar2;
      if ((bool)(~(auVar10._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar10._0_4_ ||
                  auVar6._4_4_ < auVar10._4_4_) & 1)) {
        xi[uVar4] = ((double)(int)uVar4 * dVar8) / dVar7;
      }
      if ((auVar10._12_4_ != auVar6._12_4_ || auVar10._8_4_ <= auVar6._8_4_) &&
          auVar10._12_4_ <= auVar6._12_4_) {
        xi[uVar4 + 1] = ((double)((int)uVar4 + 1) * dVar8) / dVar7;
      }
      uVar4 = uVar4 + 2;
      lVar12 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar12 + 2;
    } while (((int)uVar3 + 1U & 0xfffffffe) != uVar4);
    dVar9 = *xi;
  }
  interp1Q(f0 - dVar9,-dVar8 / dVar7,input,iVar5 + 3,xi,iVar5 + 1U,yi);
  if (-1 < iVar5) {
    uVar3 = 0;
    do {
      output[uVar3] = input[uVar3] + yi[uVar3];
      uVar3 = uVar3 + 1;
    } while (iVar5 + 1U != uVar3);
  }
  operator_delete__(yi);
  operator_delete__(xi);
  return;
}

Assistant:

void DCCorrection(const double *input, double f0, int fs, int fft_size,
    double *output) {
  int upper_limit = 2 + static_cast<int>(f0 * fft_size / fs);
  double *low_frequency_replica = new double[upper_limit];
  double *low_frequency_axis = new double[upper_limit];

  for (int i = 0; i < upper_limit; ++i)
    low_frequency_axis[i] = static_cast<double>(i) * fs / fft_size;

  int upper_limit_replica = upper_limit - 1;
  interp1Q(f0 - low_frequency_axis[0],
      -static_cast<double>(fs) / fft_size, input, upper_limit + 1,
      low_frequency_axis, upper_limit_replica, low_frequency_replica);

  for (int i = 0; i < upper_limit_replica; ++i)
    output[i] = input[i] + low_frequency_replica[i];

  delete[] low_frequency_replica;
  delete[] low_frequency_axis;
}